

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(void)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char (*pacVar7) [8];
  long lVar8;
  char *__s;
  char *__s_00;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  char *__s_01;
  char c;
  char s [100];
  byte local_a1;
  STATE local_a0;
  int local_9c;
  char local_98 [104];
  
  puts("\nREVERSI");
  do {
    puts("You can enter 0 to go first, 1 for AI to go first");
    __isoc99_scanf("%c",&local_a1);
    if (local_a1 == 0x31) {
      __s = "You will be black - (X).";
      __s_01 = "I will be white - (O)";
      __s_00 = "I will go first on the first game, then we will take turns.";
      AI_COLOR = 5;
      goto LAB_00101dc5;
    }
  } while (local_a1 != 0x30);
  __s = "I will be black - (X).";
  __s_01 = "You will be white - (O)";
  __s_00 = "You can go first on the first game, then we will take turns.";
  AI_COLOR = 4;
LAB_00101dc5:
  puts(__s_00);
  puts(__s_01);
  puts(__s);
  do {
    iVar4 = getchar();
    if (iVar4 == 10) break;
  } while (iVar4 != -1);
  puts("Select a square for your move by typing a digit for the row");
  printf("and a letter for the column with no spaces between.");
  puts("\nGood luck! Press Enter to start.");
  do {
    iVar4 = getchar();
  } while (iVar4 != 10);
LAB_00101e40:
  do {
    puts("You can choose the difficulty for the game.");
    puts("Easy   - 0");
    puts("Normal - 1");
    puts("Hard   - 2");
    puts("Hell   - 3");
    __isoc99_scanf("%c",&local_a1);
    bVar3 = local_a1 - 0x30;
  } while (3 < bVar3);
  ctx = (EVP_PKEY_CTX *)(&DAT_00103030 + *(int *)(&DAT_00103030 + (ulong)bVar3 * 4));
  MODE = (int)bVar3;
  puts((char *)ctx);
  do {
    iVar4 = getchar();
    if (iVar4 == 10) break;
  } while (iVar4 != -1);
  init(ctx);
LAB_00101ebd:
  iVar4 = 0;
  if (AI_COLOR == 4) {
    iVar4 = runAI();
  }
  pacVar7 = chessboard;
  lVar8 = 0;
  bVar2 = false;
  do {
    lVar9 = 0;
    do {
      bVar1 = true;
      if (((*pacVar7)[lVar9] == 3) || (6 - AI_COLOR == (int)(*pacVar7)[lVar9])) break;
      lVar9 = lVar9 + 1;
      bVar1 = bVar2;
    } while (lVar9 != 8);
    lVar8 = lVar8 + 1;
    pacVar7 = pacVar7 + 1;
    bVar2 = bVar1;
  } while (lVar8 != 8);
  local_9c = iVar4;
  if (bVar1) {
    do {
      local_98[0x50] = '\0';
      local_98[0x51] = '\0';
      local_98[0x52] = '\0';
      local_98[0x53] = '\0';
      local_98[0x54] = '\0';
      local_98[0x55] = '\0';
      local_98[0x56] = '\0';
      local_98[0x57] = '\0';
      local_98[0x58] = '\0';
      local_98[0x59] = '\0';
      local_98[0x5a] = '\0';
      local_98[0x5b] = '\0';
      local_98[0x5c] = '\0';
      local_98[0x5d] = '\0';
      local_98[0x5e] = '\0';
      local_98[0x5f] = '\0';
      local_98[0x40] = '\0';
      local_98[0x41] = '\0';
      local_98[0x42] = '\0';
      local_98[0x43] = '\0';
      local_98[0x44] = '\0';
      local_98[0x45] = '\0';
      local_98[0x46] = '\0';
      local_98[0x47] = '\0';
      local_98[0x48] = '\0';
      local_98[0x49] = '\0';
      local_98[0x4a] = '\0';
      local_98[0x4b] = '\0';
      local_98[0x4c] = '\0';
      local_98[0x4d] = '\0';
      local_98[0x4e] = '\0';
      local_98[0x4f] = '\0';
      local_98[0x30] = '\0';
      local_98[0x31] = '\0';
      local_98[0x32] = '\0';
      local_98[0x33] = '\0';
      local_98[0x34] = '\0';
      local_98[0x35] = '\0';
      local_98[0x36] = '\0';
      local_98[0x37] = '\0';
      local_98[0x38] = '\0';
      local_98[0x39] = '\0';
      local_98[0x3a] = '\0';
      local_98[0x3b] = '\0';
      local_98[0x3c] = '\0';
      local_98[0x3d] = '\0';
      local_98[0x3e] = '\0';
      local_98[0x3f] = '\0';
      local_98[0x20] = '\0';
      local_98[0x21] = '\0';
      local_98[0x22] = '\0';
      local_98[0x23] = '\0';
      local_98[0x24] = '\0';
      local_98[0x25] = '\0';
      local_98[0x26] = '\0';
      local_98[0x27] = '\0';
      local_98[0x28] = '\0';
      local_98[0x29] = '\0';
      local_98[0x2a] = '\0';
      local_98[0x2b] = '\0';
      local_98[0x2c] = '\0';
      local_98[0x2d] = '\0';
      local_98[0x2e] = '\0';
      local_98[0x2f] = '\0';
      local_98[0x10] = '\0';
      local_98[0x11] = '\0';
      local_98[0x12] = '\0';
      local_98[0x13] = '\0';
      local_98[0x14] = '\0';
      local_98[0x15] = '\0';
      local_98[0x16] = '\0';
      local_98[0x17] = '\0';
      local_98[0x18] = '\0';
      local_98[0x19] = '\0';
      local_98[0x1a] = '\0';
      local_98[0x1b] = '\0';
      local_98[0x1c] = '\0';
      local_98[0x1d] = '\0';
      local_98[0x1e] = '\0';
      local_98[0x1f] = '\0';
      local_98[0] = '\0';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      local_98[8] = '\0';
      local_98[9] = '\0';
      local_98[10] = '\0';
      local_98[0xb] = '\0';
      local_98[0xc] = '\0';
      local_98[0xd] = '\0';
      local_98[0xe] = '\0';
      local_98[0xf] = '\0';
      local_98[0x60] = '\0';
      local_98[0x61] = '\0';
      local_98[0x62] = '\0';
      local_98[99] = '\0';
      printf("Please enter your move (row column- no space):");
      __isoc99_scanf("%s",local_98);
      do {
        iVar4 = getchar();
        if (iVar4 == 10) break;
      } while (iVar4 != -1);
      sVar6 = strlen(local_98);
      iVar4 = AI_COLOR;
      if (sVar6 == 2) {
        lVar8 = (long)local_98[0];
        if (0xf7 < (byte)(local_98[1] + 0x97U) && 0xf7 < (byte)(local_98[0] - 0x39U)) {
          lVar9 = (long)local_98[1];
          iVar5 = (int)*(char *)(lVar9 + lVar8 * 8 + 0x104fe7);
          if ((iVar5 == 3) || (6 - AI_COLOR == iVar5)) goto LAB_00101fee;
        }
      }
      puts("Not a valid move, try again.");
    } while( true );
  }
  goto LAB_00102042;
LAB_00101fee:
  local_a0 = 9 - AI_COLOR;
  canrev(local_98[0] + -0x31,local_98[1] + -0x61,chessboard,local_a0,1);
  chessboard[lVar8 + -0x3e][lVar9 + 7] = (char)local_a0;
  chess_num[5 - iVar4] = chess_num[5 - iVar4] + 1;
  refresh();
LAB_00102042:
  iVar4 = local_9c;
  if (AI_COLOR == 5) {
    iVar4 = runAI();
  }
  iVar5 = gameover();
  if (iVar5 == 0) {
    if (bVar1) {
      if (iVar4 == 0) {
        puts("AI have to pass. You will go.");
      }
    }
    else {
      puts("You have to pass. Press enter.");
      do {
        iVar4 = getchar();
      } while (iVar4 != 10);
    }
    goto LAB_00101ebd;
  }
  puts("\nDo you want to play again?(y/n)");
  do {
    iVar4 = getchar();
    local_a1 = (byte)iVar4;
    do {
      iVar4 = getchar();
      if (iVar4 == 10) break;
    } while (iVar4 != -1);
    if ((local_a1 & 0xdf) == 0x59) goto LAB_00101e40;
    if ((local_a1 & 0xdf) == 0x4e) {
      puts("\nGoodbye!");
      getchar();
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    char c;
    printf("\nREVERSI\n");
/*#ifdef AI_COLOR_BLACK
	printf("You can go first on the first game, then we will take turns.\n");
#endif
#ifdef AI_COLOR_WHITE
	printf("I will go first on the first game, then we will take turns.\n");
#endif*/
    while (1) {
        printf("You can enter 0 to go first, 1 for AI to go first\n");
        scanf("%c", &c);
        if (c == '0') {
            AI_COLOR = WHITE;
            printf("You can go first on the first game, then we will take turns.\n");
            printf("You will be white - (O)\n");
            printf("I will be black - (X).\n");
            break;
        } else if (c == '1') {
            AI_COLOR = BLACK;
            printf("I will go first on the first game, then we will take turns.\n");
            printf("I will be white - (O)\n");
            printf("You will be black - (X).\n");
            break;
        }
    }
    clean_stdin();

    printf("Select a square for your move by typing a digit for the row\n");
    printf("and a letter for the column with no spaces between.");
    printf("\nGood luck! Press Enter to start.\n");
    while (getchar() != '\n') {}

    while (1) {
        while (1) {
            printf("You can choose the difficulty for the game.\n");
            printf("Easy   - 0\n");
            printf("Normal - 1\n");
            printf("Hard   - 2\n");
            printf("Hell   - 3\n");
            scanf("%c", &c);
            if (c == '0') {
                MODE = MODE_EASY;
                printf("You choose the easy mode\n\n");
                break;
            } else if (c == '1') {
                MODE = MODE_NORM;
                printf("You choose the normal mode\n\n");
                break;
            } else if (c == '2') {
                MODE = MODE_HARD;
                printf("You choose the hard mode\n\n");
                break;
            } else if (c == '3') {
                MODE = MODE_HELL;
                printf("You choose the hell mode\n\n");
                break;
            }
        }
        clean_stdin();
        init();
        int i, j;
        while (1) {
            int player_move = 0, ai_move = 0;

            if (AI_COLOR == WHITE) {
                ai_move = runAI();
            }

/*#ifdef AI_COLOR_WHITE
			ai_move = runAI();
#endif*/

            for (i = 0; i < SIZE; i++) {
                for (j = 0; j < SIZE; j++) {
                    if (chessboard[i][j] == COLOR_(COLOR_rev(AI_COLOR)) || chessboard[i][j] == BOTH)
/*#ifdef AI_COLOR_BLACK
					if (chessboard[i][j] == WHITE_ || chessboard[i][j] == BOTH)
#endif
#ifdef AI_COLOR_WHITE
					if (chessboard[i][j] == BLACK_ || chessboard[i][j] == BOTH)
#endif*/
                    {
                        player_move = 1;
                        break;
                    }
                }
            }

            while (player_move) {

                char s[100] = {0};
                printf("Please enter your move (row column- no space):");
                scanf("%s", s);
                clean_stdin();
                if (strlen(s) != 2) {
                    printf("Not a valid move, try again.\n");
                    continue;
                }
                int x = s[0] - '1';
                int y = s[1] - 'a';
                if (x < 0 || x >= SIZE || y < 0 || y >= SIZE) {
                    printf("Not a valid move, try again.\n");
                    continue;
                }

                if (chessboard[x][y] != COLOR_(COLOR_rev(AI_COLOR)) && chessboard[x][y] != BOTH)
/*#ifdef AI_COLOR_BLACK
				if (chessboard[x][y] != WHITE_&&chessboard[x][y] != BOTH)
#endif
#ifdef AI_COLOR_WHITE
				if (chessboard[x][y] != BLACK_&&chessboard[x][y] != BOTH)
#endif*/
                {
                    printf("Not a valid move, try again.\n");
                    continue;
                }

                putchess(x, y, COLOR_rev(AI_COLOR));

/*#ifdef AI_COLOR_BLACK
				putchess(x, y, WHITE);
#endif
#ifdef AI_COLOR_WHITE
				putchess(x, y, BLACK);
#endif*/
                refresh();
                break;
            }

            if (AI_COLOR == BLACK) {
                ai_move = runAI();
            }
/*#ifdef AI_COLOR_BLACK
			ai_move = runAI();
#endif*/

            if (gameover() == 1) {
                break;
            } else if (player_move == 0) {
                printf("You have to pass. Press enter.\n");
                while (getchar() != '\n') {}
            } else if (ai_move == 0) {
                printf("AI have to pass. You will go.\n");
            }
        }
        printf("\nDo you want to play again?(y/n)\n");
        while (1) {
            c = getchar();
            clean_stdin();
            if (c == 'Y' || c == 'y') {
                break;
            } else if (c == 'N' || c == 'n') {
                printf("\nGoodbye!\n");
                getchar();
                return 0;
            }
        }
    }
    return 0;
}